

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void luaC_fix(lua_State *L,GCObject *o)

{
  global_State *pgVar1;
  
  pgVar1 = L->l_G;
  if (pgVar1->allgc == o) {
    o->marked = o->marked & 0xc0 | 4;
    pgVar1->allgc = o->next;
    o->next = pgVar1->fixedgc;
    pgVar1->fixedgc = o;
    return;
  }
  __assert_fail("g->allgc == o",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                ,0x14c,"void luaC_fix(lua_State *, GCObject *)");
}

Assistant:

void luaC_fix (lua_State *L, GCObject *o) {
  global_State *g = G(L);
  lua_assert(g->allgc == o);  /* object must be 1st in 'allgc' list! */
  set2gray(o);  /* they will be gray forever */
  setage(o, G_OLD);  /* and old forever */
  g->allgc = o->next;  /* remove object from 'allgc' list */
  o->next = g->fixedgc;  /* link it to 'fixedgc' list */
  g->fixedgc = o;
}